

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcBoxedHalfSpace::~IfcBoxedHalfSpace(IfcBoxedHalfSpace *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].super_IfcHalfSpaceSolid.super_IfcGeometricRepresentationItem.field_0x30 =
       0x87c9f0;
  *(undefined8 *)
   &(this->super_IfcHalfSpaceSolid).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem
    .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x18 = 0x87ca68;
  this[-1].super_IfcHalfSpaceSolid.AgreementFlag._M_string_length = 0x87ca18;
  *(undefined8 *)((long)&this[-1].super_IfcHalfSpaceSolid.AgreementFlag.field_2 + 8) = 0x87ca40;
  puVar1 = *(undefined1 **)&this[-1].super_IfcHalfSpaceSolid.field_0x68;
  if (puVar1 != &this[-1].field_0x78) {
    operator_delete(puVar1,*(long *)&this[-1].field_0x78 + 1);
  }
  operator_delete(&this[-1].super_IfcHalfSpaceSolid.super_IfcGeometricRepresentationItem.field_0x30,
                  0x88);
  return;
}

Assistant:

IfcBoxedHalfSpace() : Object("IfcBoxedHalfSpace") {}